

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O1

Identifier __thiscall soul::Identifier::Pool::get(Pool *this,string_view newString)

{
  pointer puVar1;
  size_t __n;
  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  _Var2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var7;
  char cVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  char *local_48;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  Pool *local_38;
  
  local_48 = newString._M_str;
  uVar10 = newString._M_len;
  if (uVar10 == 0) {
    throwInternalCompilerError("! newString.empty()","get",0x34);
  }
  puVar1 = (this->strings).
           super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar12 = (long)(this->strings).
                 super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  uVar11 = 0;
  local_38 = this;
  do {
    if (uVar12 <= uVar11) goto LAB_001f2d9b;
    _Var7._M_head_impl =
         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
          &puVar1[uVar11]._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    __n = *(size_t *)((long)_Var7._M_head_impl + 8);
    if ((__n != uVar10) ||
       ((cVar8 = '\x01', __n != 0 &&
        (iVar4 = bcmp(*(void **)_Var7._M_head_impl,local_48,__n), iVar4 != 0)))) {
      uVar9 = uVar12 + uVar11 >> 1;
      _Var2.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           puVar1[uVar9]._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      uVar3 = *(ulong *)((long)_Var2.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl + 8);
      if (uVar3 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = uVar3;
        if (uVar10 < uVar3) {
          uVar6 = uVar10;
        }
        uVar5 = memcmp(local_48,*(void **)_Var2.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl,uVar6);
        uVar6 = (ulong)uVar5;
      }
      if ((int)uVar6 == 0) {
        uVar6 = uVar10 - uVar3;
        if ((long)uVar6 < -0x7fffffff) {
          uVar6 = 0xffffffff80000000;
        }
        if (0x7ffffffe < (long)uVar6) {
          uVar6 = 0x7fffffff;
        }
      }
      bVar14 = -1 < (int)uVar6;
      uVar6 = uVar9;
      uVar3 = uVar11;
      if (bVar14) {
        uVar6 = uVar12;
        uVar3 = uVar9;
      }
      bVar13 = uVar9 == uVar11;
      if (!bVar13) {
        uVar12 = uVar6;
      }
      cVar8 = bVar13 * '\x03';
      uVar11 = bVar14 + uVar11;
      _Var7._M_head_impl = local_40._M_head_impl;
      if (!bVar13) {
        uVar11 = uVar3;
      }
    }
    local_40._M_head_impl = _Var7._M_head_impl;
  } while (cVar8 == '\0');
  _Var7._M_head_impl = local_40._M_head_impl;
  if (cVar8 == '\x03') {
LAB_001f2d9b:
    _Var7._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
    ((_Var7._M_head_impl)->_M_dataplus)._M_p = (pointer)&(_Var7._M_head_impl)->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)_Var7._M_head_impl,local_48,local_48 + uVar10);
    local_50._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )_Var7._M_head_impl;
    std::
    vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::_M_insert_rval(&local_38->strings,
                     (local_38->strings).
                     super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (int)uVar11,(value_type *)&local_50
                    );
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_50._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_50._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    }
  }
  return (Identifier)_Var7._M_head_impl;
}

Assistant:

Identifier get (std::string_view newString)
        {
            SOUL_ASSERT (! newString.empty());

            size_t s = 0;
            size_t e = strings.size();

            while (s < e)
            {
                auto* elem = strings[s].get();

                if (*elem == newString)
                    return Identifier (elem);

                auto halfway = (s + e) / 2;
                bool isBeforeHalfway = (newString < *strings[halfway]);

                if (halfway == s)
                {
                    if (! isBeforeHalfway)
                        ++s;

                    break;
                }

                if (isBeforeHalfway)
                    e = halfway;
                else
                    s = halfway;
            }

            auto* sharedString = new std::string (newString);
            strings.insert (strings.begin() + (int) s, std::unique_ptr<std::string> (sharedString));
            return Identifier (sharedString);
        }